

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O2

pair<double,_double> __thiscall
manager::Manager<uttt::IBoard>::Match
          (Manager<uttt::IBoard> *this,longlong bot_id1,longlong bot_id2,int count)

{
  IBoard *pIVar1;
  double dVar2;
  undefined1 auVar3 [12];
  short sVar4;
  short sVar5;
  ulong uVar6;
  IBot<uttt::IBoard> *pIVar7;
  uint uVar8;
  int iVar9;
  iterator iVar10;
  iterator iVar11;
  IBoard *this_00;
  IBot<uttt::IBoard> *pIVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined8 uVar17;
  undefined1 auVar16 [16];
  pair<double,_double> pVar18;
  undefined1 local_98 [32];
  IBot<uttt::IBoard> *bs [2];
  IMove move;
  Manager<uttt::IBoard> *local_48;
  longlong bot_id2_local;
  longlong bot_id1_local;
  
  local_48 = this;
  bot_id2_local = bot_id2;
  bot_id1_local = bot_id1;
  iVar10 = std::
           _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->bots)._M_h,&bot_id1_local);
  iVar11 = std::
           _Hashtable<long_long,_std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_std::allocator<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>_>,_std::__detail::_Select1st,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->bots)._M_h,&bot_id2_local);
  uVar14 = 0;
  uVar8 = 0;
  if (0 < count) {
    uVar8 = count;
  }
  local_98._0_16_ = ZEXT816(0);
  do {
    if (uVar14 == uVar8) {
      dVar2 = (double)count;
      auVar15._8_4_ = SUB84(dVar2,0);
      auVar15._0_8_ = dVar2;
      auVar15._12_4_ = (int)((ulong)dVar2 >> 0x20);
      auVar15 = divpd(local_98._0_16_,auVar15);
      uVar17 = 0;
      pVar18 = MM::operator()((MM *)bs,*(double *)
                                        (*(long *)((long)iVar10.
                                                  super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                                                  ._M_cur + 0x10) + 0x10),
                              *(double *)
                               (*(long *)((long)iVar11.
                                                super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                                                ._M_cur + 0x10) + 0x10),auVar15._0_8_);
      *(double *)
       (*(long *)((long)iVar10.
                        super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                        ._M_cur + 0x10) + 0x10) = pVar18.first;
      *(double *)
       (*(long *)((long)iVar11.
                        super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                        ._M_cur + 0x10) + 0x10) = pVar18.second;
      auVar3._4_8_ = uVar17;
      auVar3._0_4_ = auVar15._4_4_;
      auVar16._0_8_ = auVar3._0_8_ << 0x20;
      auVar16._8_4_ = auVar15._8_4_;
      auVar16._12_4_ = auVar15._12_4_;
      pVar18.second = auVar16._8_8_;
      pVar18.first = auVar15._0_8_;
      return pVar18;
    }
    this_00 = (IBoard *)operator_new(0x18);
    pIVar1 = local_48->game;
    sVar4 = (pIVar1->micro)._M_elems[0];
    sVar5 = (pIVar1->micro)._M_elems[1];
    uVar17 = *(undefined8 *)((pIVar1->micro)._M_elems + 2);
    this_00->macro = pIVar1->macro;
    (this_00->micro)._M_elems[0] = sVar4;
    (this_00->micro)._M_elems[1] = sVar5;
    *(undefined8 *)((this_00->micro)._M_elems + 2) = uVar17;
    *(undefined8 *)((this_00->micro)._M_elems + 6) = *(undefined8 *)((pIVar1->micro)._M_elems + 6);
    bs[0] = (IBot<uttt::IBoard> *)0x0;
    bs[1] = (IBot<uttt::IBoard> *)0x0;
    pIVar12 = (IBot<uttt::IBoard> *)
              (**(code **)(**(long **)(*(long *)((long)iVar10.
                                                  super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                                                  ._M_cur + 0x10) + 8) + 0x10))();
    uVar13 = uVar14 & 1;
    bs[uVar13] = pIVar12;
    pIVar12 = (IBot<uttt::IBoard> *)
              (**(code **)(**(long **)(*(long *)((long)iVar11.
                                                  super__Node_iterator_base<std::pair<const_long_long,_manager::Bot<uttt::IBoard>_*>,_false>
                                                  ._M_cur + 0x10) + 8) + 0x10))();
    bs[uVar13 ^ 1] = pIVar12;
    iVar9 = uttt::IBoard::GetStatus(this_00);
    pIVar7 = bs[1];
    pIVar12 = bs[0];
    while (iVar9 == -1) {
      iVar9 = (*pIVar12->_vptr_IBot[3])(pIVar12);
      move = CONCAT44(extraout_var,iVar9);
      uttt::IBoard::ApplyMove(this_00,&move);
      (*pIVar7->_vptr_IBot[4])(pIVar7,&move);
      iVar9 = uttt::IBoard::GetStatus(this_00);
      if (iVar9 != -1) break;
      iVar9 = (*pIVar7->_vptr_IBot[3])(pIVar7);
      move = CONCAT44(extraout_var_00,iVar9);
      uttt::IBoard::ApplyMove(this_00,&move);
      (*pIVar12->_vptr_IBot[4])(pIVar12,&move);
      iVar9 = uttt::IBoard::GetStatus(this_00);
    }
    if (iVar9 == 1) {
      if (uVar13 != 0) goto LAB_00163d0f;
LAB_00163cf6:
      dVar2 = (double)local_98._0_8_ + 1.0;
LAB_00163d03:
      uVar6 = (ulong)local_98._8_8_ >> 0x20;
      local_98._8_4_ = (int)local_98._8_8_;
      local_98._0_8_ = dVar2;
      local_98._12_4_ = (int)uVar6;
    }
    else {
      if (iVar9 == 0) {
        dVar2 = (double)local_98._0_8_ + 0.5;
        local_98._8_8_ = (double)local_98._8_8_ + 0.5;
        goto LAB_00163d03;
      }
      if (uVar13 != 0) goto LAB_00163cf6;
LAB_00163d0f:
      local_98._8_8_ = (double)local_98._8_8_ + 1.0;
    }
    if (pIVar12 != (IBot<uttt::IBoard> *)0x0) {
      (*pIVar12->_vptr_IBot[1])(pIVar12);
    }
    if (pIVar7 != (IBot<uttt::IBoard> *)0x0) {
      (*pIVar7->_vptr_IBot[1])(pIVar7);
    }
    operator_delete(this_00);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

std::pair<double, double>
Manager<IGame>::Match(long long bot_id1, long long bot_id2, int count)
{
    auto it1 = bots.find(bot_id1), it2 = bots.find(bot_id2);

    std::pair<double, double> results;

    for (int i = 0; i < count; ++i)
    {
        auto game_copy = new IGame(*game);
        game::IBot<IGame> *bs[2] = {};
        bs[i % 2] = it1->second->bot->Clone();
        bs[1 - i % 2] = it2->second->bot->Clone();
        int status = game_copy->GetStatus();
        while (status == game::Undecided)
        {
            auto move = bs[0]->MakeMove();
            game_copy->ApplyMove(move);
            bs[1]->SendMove(move);

            status = game_copy->GetStatus();
            if (status != game::Undecided)
                break;

            move = bs[1]->MakeMove();
            game_copy->ApplyMove(move);
            bs[0]->SendMove(move);

            status = game_copy->GetStatus();
        }

        if (status == game::Draw)
            results.first += 0.5, results.second += 0.5;
        else if (status == 1)
            i % 2 == 0 ? results.first += 1.0 : results.second += 1.0;
        else
            i % 2 == 0 ? results.second += 1.0 : results.first += 1.0;

        delete bs[0];
        delete bs[1];
        delete game_copy;
    }

    results.first /= count, results.second /= count;

    auto new_ratings = MM()(it1->second->rating, it2->second->rating, results.first);
    it1->second->rating = new_ratings.first, it2->second->rating = new_ratings.second;

    return results;
}